

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# openssl-client.c
# Opt level: O2

int lws_tls_client_create_vhost_context
              (lws_vhost *vh,lws_context_creation_info *info,char *cipher_list,char *ca_filepath,
              void *ca_mem,uint ca_mem_len,char *cert_filepath,void *cert_mem,uint cert_mem_len,
              char *private_key_filepath)

{
  long *d;
  long *d_00;
  lws_dll2 *plVar1;
  lws_context *plVar2;
  lws_vhost *plVar3;
  char *str;
  lws_context_creation_info *info_00;
  int iVar4;
  lws_tls_extant lVar5;
  uint uVar6;
  SSL_METHOD *meth;
  EVP_MD_CTX *ctx;
  EVP_MD *type;
  size_t sVar7;
  int *piVar8;
  SSL_CTX *pSVar9;
  undefined8 *data;
  ulong uVar10;
  char *pcVar11;
  X509 *x;
  X509_STORE *ctx_00;
  char *pcVar12;
  bool bVar13;
  char c;
  lws_vhost *local_b8;
  char *local_b0;
  uint8_t *up1;
  uint len;
  char *local_98;
  char *local_90;
  lws_filepos_t amount;
  ulong local_80;
  long *local_78;
  long *local_70;
  lws_context_creation_info *local_68;
  uint8_t *up;
  uint8_t hash [32];
  
  uVar10 = (ulong)ca_mem_len;
  local_90 = cipher_list;
  meth = (SSL_METHOD *)TLS_client_method();
  if (meth == (SSL_METHOD *)0x0) {
    uVar10 = ERR_get_error();
    pcVar11 = ERR_error_string(uVar10,(char *)vh->context->pt[0].serv_buf);
    pcVar12 = "problem creating ssl method %lu: %s\n";
  }
  else {
    local_b0 = (char *)ca_mem;
    local_98 = ca_filepath;
    ctx = (EVP_MD_CTX *)EVP_MD_CTX_new();
    if (ctx == (EVP_MD_CTX *)0x0) {
      return 1;
    }
    type = EVP_sha256();
    iVar4 = EVP_DigestInit_ex(ctx,type,(ENGINE *)0x0);
    if (iVar4 != 1) {
      EVP_MD_CTX_free(ctx);
      return 1;
    }
    d = &info->ssl_client_options_set;
    if (info->ssl_client_options_set != 0) {
      EVP_DigestUpdate(ctx,d,8);
    }
    d_00 = &info->ssl_client_options_clear;
    local_70 = d;
    if (info->ssl_client_options_clear != 0) {
      EVP_DigestUpdate(ctx,d_00,8);
    }
    pcVar11 = local_90;
    local_78 = d_00;
    if (local_90 != (char *)0x0) {
      sVar7 = strlen(local_90);
      EVP_DigestUpdate(ctx,pcVar11,sVar7);
    }
    pcVar11 = info->client_tls_1_3_plus_cipher_list;
    local_68 = info;
    if (pcVar11 != (char *)0x0) {
      sVar7 = strlen(pcVar11);
      EVP_DigestUpdate(ctx,pcVar11,sVar7);
    }
    if ((vh->options & 0x40) == 0) {
      c = '\x01';
      EVP_DigestUpdate(ctx,&c,1);
    }
    pcVar11 = local_98;
    if (local_98 != (char *)0x0) {
      sVar7 = strlen(local_98);
      EVP_DigestUpdate(ctx,pcVar11,sVar7);
    }
    if (cert_filepath != (char *)0x0) {
      sVar7 = strlen(cert_filepath);
      EVP_DigestUpdate(ctx,cert_filepath,sVar7);
    }
    if (private_key_filepath != (char *)0x0) {
      sVar7 = strlen(private_key_filepath);
      EVP_DigestUpdate(ctx,private_key_filepath,sVar7);
    }
    bVar13 = local_b0 != (char *)0x0;
    if (ca_mem_len != 0 && bVar13) {
      EVP_DigestUpdate(ctx,local_b0,uVar10);
    }
    local_b8 = vh;
    local_80 = uVar10;
    if (cert_mem_len != 0 && cert_mem != (void *)0x0) {
      EVP_DigestUpdate(ctx,cert_mem,(ulong)cert_mem_len);
    }
    len = 0x20;
    EVP_DigestFinal_ex(ctx,hash,&len);
    EVP_MD_CTX_free(ctx);
    info_00 = local_68;
    plVar1 = (lws_dll2 *)&(local_b8->context->tls).cc_owner;
    uVar10 = (ulong)len;
    while (plVar1 = plVar1->next, plVar1 != (lws_dll2 *)0x0) {
      iVar4 = bcmp(hash,&plVar1[-2].owner,uVar10);
      if (iVar4 == 0) {
        *(int *)&plVar1[1].prev = *(int *)&plVar1[1].prev + 1;
        (local_b8->tls).ssl_client_ctx = (lws_tls_ctx *)plVar1[-2].next;
        _lws_log(8,"%s: vh %s: reusing client ctx %d: use %d\n",
                 "lws_tls_client_create_vhost_context",local_b8->name,
                 (ulong)*(uint *)((long)&plVar1[1].prev + 4));
        return 0;
      }
    }
    piVar8 = __errno_location();
    *piVar8 = 0;
    ERR_clear_error();
    pSVar9 = SSL_CTX_new(meth);
    plVar3 = local_b8;
    (local_b8->tls).ssl_client_ctx = (lws_tls_ctx *)pSVar9;
    if (pSVar9 != (SSL_CTX *)0x0) {
      data = (undefined8 *)lws_zalloc(0x48,"client ctx tcr");
      pSVar9 = (SSL_CTX *)(plVar3->tls).ssl_client_ctx;
      if (data == (undefined8 *)0x0) {
        SSL_CTX_free(pSVar9);
        return 1;
      }
      *data = pSVar9;
      *(undefined4 *)(data + 8) = 1;
      memcpy(data + 1,hash,(ulong)len);
      plVar2 = plVar3->context;
      iVar4 = (plVar2->tls).count_client_contexts;
      (plVar2->tls).count_client_contexts = iVar4 + 1;
      *(int *)((long)data + 0x44) = iVar4;
      lws_dll2_add_head((lws_dll2 *)(data + 5),&(plVar2->tls).cc_owner);
      _lws_log(8,"%s: vh %s: created new client ctx %d\n","lws_tls_client_create_vhost_context",
               plVar3->name,(ulong)*(uint *)((long)data + 0x44));
      SSL_CTX_set_ex_data((SSL_CTX *)(plVar3->tls).ssl_client_ctx,openssl_SSL_CTX_private_data_index
                          ,data);
      SSL_CTX_set_options((plVar3->tls).ssl_client_ctx,0x20000);
      SSL_CTX_set_options((plVar3->tls).ssl_client_ctx,0x400000);
      SSL_CTX_ctrl((SSL_CTX *)(plVar3->tls).ssl_client_ctx,0x21,0x12,(void *)0x0);
      if (*local_70 != 0) {
        SSL_CTX_set_options((plVar3->tls).ssl_client_ctx);
      }
      str = local_90;
      pcVar12 = local_98;
      pcVar11 = local_b0;
      if (*local_78 != 0) {
        SSL_CTX_clear_options((plVar3->tls).ssl_client_ctx);
      }
      if (str != (char *)0x0) {
        SSL_CTX_set_cipher_list((SSL_CTX *)(plVar3->tls).ssl_client_ctx,str);
      }
      if (info_00->client_tls_1_3_plus_cipher_list != (char *)0x0) {
        SSL_CTX_set_ciphersuites((plVar3->tls).ssl_client_ctx);
      }
      uVar10 = local_80;
      if ((plVar3->options & 0x40) == 0) {
        SSL_CTX_set_default_verify_paths((SSL_CTX *)(plVar3->tls).ssl_client_ctx);
      }
      if (pcVar12 == (char *)0x0 && (ca_mem_len == 0 || !bVar13)) {
        iVar4 = SSL_CTX_load_verify_locations
                          ((SSL_CTX *)(plVar3->tls).ssl_client_ctx,(char *)0x0,"../share");
        if (iVar4 == 0) {
          _lws_log(1,
                   "Unable to load SSL Client certs from %s (set by LWS_OPENSSL_CLIENT_CERTS) -- client ssl isn\'t going to work\n"
                   ,"../share");
        }
      }
      else if (pcVar12 == (char *)0x0) {
        amount = 0;
        iVar4 = lws_tls_alloc_pem_to_der_file
                          (plVar3->context,(char *)0x0,pcVar11,uVar10,&up1,&amount);
        if (iVar4 != 0) {
          _lws_log(1,"%s: Unable to decode x.509 mem\n","lws_tls_client_create_vhost_context");
          lwsl_hexdump_level(4,pcVar11,uVar10);
          return 1;
        }
        up = up1;
        x = d2i_X509((X509 **)0x0,&up,amount);
        if (x == (X509 *)0x0) {
          _lws_log(1,"%s: d2i_X509 failed\n","lws_tls_client_create_vhost_context");
          lwsl_hexdump_level(4,up1,amount);
          lws_tls_err_describe_clear();
        }
        else {
          ctx_00 = X509_STORE_new();
          iVar4 = X509_STORE_add_cert(ctx_00,x);
          if (iVar4 == 0) {
            X509_STORE_free(ctx_00);
            _lws_log(1,
                     "Unable to load SSL Client certs from ssl_ca_mem -- client ssl isn\'t going to work\n"
                    );
            lws_tls_err_describe_clear();
          }
          else {
            SSL_CTX_set_cert_store((SSL_CTX *)(plVar3->tls).ssl_client_ctx,ctx_00);
            _lws_log(8,"loaded ssl_ca_mem\n");
          }
          X509_free(x);
        }
        lws_realloc(up1,0,"lws_free");
      }
      else {
        iVar4 = SSL_CTX_load_verify_locations
                          ((SSL_CTX *)(plVar3->tls).ssl_client_ctx,pcVar12,(char *)0x0);
        if (iVar4 == 0) {
          _lws_log(1,
                   "Unable to load SSL Client certs file from %s -- client ssl isn\'t going to work\n"
                   ,pcVar12);
          lws_tls_err_describe_clear();
        }
        else {
          _lws_log(8,"loaded ssl_ca_filepath\n");
        }
      }
      if (cert_filepath == (char *)0x0) {
        if ((cert_mem_len != 0 && cert_mem != (void *)0x0) &&
           (iVar4 = SSL_CTX_use_certificate_ASN1
                              ((SSL_CTX *)(plVar3->tls).ssl_client_ctx,cert_mem_len,
                               (uchar *)cert_mem), iVar4 < 1)) {
          _lws_log(1,"%s: problem interpreting client cert\n","lws_tls_client_create_vhost_context")
          ;
          goto LAB_001294c3;
        }
      }
      else {
        lVar5 = lws_tls_use_any_upgrade_check_extant(cert_filepath);
        if ((lVar5 != LWS_TLS_EXTANT_YES) && ((info_00->options & 0x4000000) != 0)) {
          return 0;
        }
        _lws_log(4,"%s: doing cert filepath %s\n","lws_tls_client_create_vhost_context",
                 cert_filepath);
        uVar6 = SSL_CTX_use_certificate_chain_file
                          ((SSL_CTX *)(plVar3->tls).ssl_client_ctx,cert_filepath);
        if ((int)uVar6 < 1) {
          _lws_log(1,"problem %d getting cert \'%s\'\n",(ulong)uVar6,cert_filepath);
LAB_001294c3:
          lws_tls_err_describe_clear();
          return 1;
        }
        _lws_log(4,"Loaded client cert %s\n",cert_filepath);
      }
      if (private_key_filepath == (char *)0x0) {
        return 0;
      }
      _lws_log(4,"%s: doing private key filepath\n","lws_tls_client_create_vhost_context");
      lws_ssl_bind_passphrase((plVar3->tls).ssl_client_ctx,1,info_00);
      iVar4 = SSL_CTX_use_PrivateKey_file
                        ((SSL_CTX *)(plVar3->tls).ssl_client_ctx,private_key_filepath,1);
      if (iVar4 == 1) {
        _lws_log(4,"Loaded client cert private key %s\n",private_key_filepath);
        iVar4 = SSL_CTX_check_private_key((SSL_CTX *)(plVar3->tls).ssl_client_ctx);
        if (iVar4 != 0) {
          return 0;
        }
        _lws_log(1,"Private SSL key doesn\'t match cert\n");
        return 1;
      }
      _lws_log(1,"use_PrivateKey_file \'%s\'\n",private_key_filepath);
      lws_tls_err_describe_clear();
      return 1;
    }
    uVar10 = ERR_get_error();
    pcVar11 = ERR_error_string(uVar10,(char *)plVar3->context->pt[0].serv_buf);
    pcVar12 = "problem creating ssl context %lu: %s\n";
  }
  _lws_log(1,pcVar12,uVar10,pcVar11);
  return 1;
}

Assistant:

int
lws_tls_client_create_vhost_context(struct lws_vhost *vh,
				    const struct lws_context_creation_info *info,
				    const char *cipher_list,
				    const char *ca_filepath,
				    const void *ca_mem,
				    unsigned int ca_mem_len,
				    const char *cert_filepath,
				    const void *cert_mem,
				    unsigned int cert_mem_len,
				    const char *private_key_filepath)
{
	struct lws_tls_client_reuse *tcr;
	X509_STORE *x509_store;
	unsigned long error;
	SSL_METHOD *method;
	EVP_MD_CTX *mdctx;
	unsigned int len;
	uint8_t hash[32];
	X509 *client_CA;
	char c;
	int n;

	/* basic openssl init already happened in context init */

	/* choose the most recent spin of the api */
#if defined(LWS_HAVE_TLS_CLIENT_METHOD)
	method = (SSL_METHOD *)TLS_client_method();
#elif defined(LWS_HAVE_TLSV1_2_CLIENT_METHOD)
	method = (SSL_METHOD *)TLSv1_2_client_method();
#else
	method = (SSL_METHOD *)SSLv23_client_method();
#endif

	if (!method) {
		error = ERR_get_error();
		lwsl_err("problem creating ssl method %lu: %s\n",
			error, ERR_error_string(error,
				      (char *)vh->context->pt[0].serv_buf));
		return 1;
	}

	/*
	 * OpenSSL client contexts are quite expensive, because they bring in
	 * the system certificate bundle for each one.  So if you have multiple
	 * vhosts, each with a client context, it can add up to several
	 * megabytes of heap.  In the case the client contexts are configured
	 * identically, they could perfectly well have shared just the one.
	 *
	 * For that reason, use a hash to fingerprint the context configuration
	 * and prefer to reuse an existing one with the same fingerprint if
	 * possible.
	 */

	 mdctx = EVP_MD_CTX_create();
	 if (!mdctx)
		 return 1;

	if (EVP_DigestInit_ex(mdctx, EVP_sha256(), NULL) != 1) {
		EVP_MD_CTX_destroy(mdctx);

		return 1;
	}

	if (info->ssl_client_options_set)
		EVP_DigestUpdate(mdctx, &info->ssl_client_options_set,
				 sizeof(info->ssl_client_options_set));

#if (OPENSSL_VERSION_NUMBER >= 0x009080df) && !defined(USE_WOLFSSL)
	if (info->ssl_client_options_clear)
		EVP_DigestUpdate(mdctx, &info->ssl_client_options_clear,
				 sizeof(info->ssl_client_options_clear));
#endif

	if (cipher_list)
		EVP_DigestUpdate(mdctx, cipher_list, strlen(cipher_list));

#if defined(LWS_HAVE_SSL_CTX_set_ciphersuites)
	if (info->client_tls_1_3_plus_cipher_list)
		EVP_DigestUpdate(mdctx, info->client_tls_1_3_plus_cipher_list,
				 strlen(info->client_tls_1_3_plus_cipher_list));
#endif

	if (!lws_check_opt(vh->options, LWS_SERVER_OPTION_DISABLE_OS_CA_CERTS)) {
		c = 1;
		EVP_DigestUpdate(mdctx, &c, 1);
	}

	if (ca_filepath)
		EVP_DigestUpdate(mdctx, ca_filepath, strlen(ca_filepath));

	if (cert_filepath)
		EVP_DigestUpdate(mdctx, cert_filepath, strlen(cert_filepath));

	if (private_key_filepath)
		EVP_DigestUpdate(mdctx, private_key_filepath,
				 strlen(private_key_filepath));
	if (ca_mem && ca_mem_len)
		EVP_DigestUpdate(mdctx, ca_mem, ca_mem_len);

	if (cert_mem && cert_mem_len)
		EVP_DigestUpdate(mdctx, cert_mem, cert_mem_len);

	len = sizeof(hash);
	EVP_DigestFinal_ex(mdctx, hash, &len);
	EVP_MD_CTX_destroy(mdctx);

	/* look for existing client context with same config already */

	lws_start_foreach_dll_safe(struct lws_dll2 *, p, tp,
			 lws_dll2_get_head(&vh->context->tls.cc_owner)) {
		tcr = lws_container_of(p, struct lws_tls_client_reuse, cc_list);

		if (!memcmp(hash, tcr->hash, len)) {

			/* it's a match */

			tcr->refcount++;
			vh->tls.ssl_client_ctx = tcr->ssl_client_ctx;

			lwsl_info("%s: vh %s: reusing client ctx %d: use %d\n",
				   __func__, vh->name, tcr->index,
				   tcr->refcount);

			return 0;
		}
	} lws_end_foreach_dll_safe(p, tp);

	/* no existing one the same... create new client SSL_CTX */

	errno = 0;
	ERR_clear_error();
	vh->tls.ssl_client_ctx = SSL_CTX_new(method);
	if (!vh->tls.ssl_client_ctx) {
		error = ERR_get_error();
		lwsl_err("problem creating ssl context %lu: %s\n",
			error, ERR_error_string(error,
				      (char *)vh->context->pt[0].serv_buf));
		return 1;
	}

	tcr = lws_zalloc(sizeof(*tcr), "client ctx tcr");
	if (!tcr) {
		SSL_CTX_free(vh->tls.ssl_client_ctx);
		return 1;
	}

	tcr->ssl_client_ctx = vh->tls.ssl_client_ctx;
	tcr->refcount = 1;
	memcpy(tcr->hash, hash, len);
	tcr->index = vh->context->tls.count_client_contexts++;
	lws_dll2_add_head(&tcr->cc_list, &vh->context->tls.cc_owner);

	lwsl_info("%s: vh %s: created new client ctx %d\n", __func__,
			vh->name, tcr->index);

	/* bind the tcr to the client context */

	SSL_CTX_set_ex_data(vh->tls.ssl_client_ctx,
			    openssl_SSL_CTX_private_data_index,
			    (char *)tcr);

#ifdef SSL_OP_NO_COMPRESSION
	SSL_CTX_set_options(vh->tls.ssl_client_ctx, SSL_OP_NO_COMPRESSION);
#endif

	SSL_CTX_set_options(vh->tls.ssl_client_ctx,
			    SSL_OP_CIPHER_SERVER_PREFERENCE);

	SSL_CTX_set_mode(vh->tls.ssl_client_ctx,
			 SSL_MODE_ACCEPT_MOVING_WRITE_BUFFER |
			 SSL_MODE_RELEASE_BUFFERS);

	if (info->ssl_client_options_set)
		SSL_CTX_set_options(vh->tls.ssl_client_ctx,
				    info->ssl_client_options_set);

	/* SSL_clear_options introduced in 0.9.8m */
#if (OPENSSL_VERSION_NUMBER >= 0x009080df) && !defined(USE_WOLFSSL)
	if (info->ssl_client_options_clear)
		SSL_CTX_clear_options(vh->tls.ssl_client_ctx,
				      info->ssl_client_options_clear);
#endif

	if (cipher_list)
		SSL_CTX_set_cipher_list(vh->tls.ssl_client_ctx, cipher_list);

#if defined(LWS_HAVE_SSL_CTX_set_ciphersuites)
	if (info->client_tls_1_3_plus_cipher_list)
		SSL_CTX_set_ciphersuites(vh->tls.ssl_client_ctx,
					 info->client_tls_1_3_plus_cipher_list);
#endif

#ifdef LWS_SSL_CLIENT_USE_OS_CA_CERTS
	if (!lws_check_opt(vh->options, LWS_SERVER_OPTION_DISABLE_OS_CA_CERTS))
		/* loads OS default CA certs */
		SSL_CTX_set_default_verify_paths(vh->tls.ssl_client_ctx);
#endif

	/* openssl init for cert verification (for client sockets) */
	if (!ca_filepath && (!ca_mem || !ca_mem_len)) {
		if (!SSL_CTX_load_verify_locations(
			vh->tls.ssl_client_ctx, NULL, LWS_OPENSSL_CLIENT_CERTS))
			lwsl_err("Unable to load SSL Client certs from %s "
			    "(set by LWS_OPENSSL_CLIENT_CERTS) -- "
			    "client ssl isn't going to work\n",
			    LWS_OPENSSL_CLIENT_CERTS);
	} else if (ca_filepath) {
		if (!SSL_CTX_load_verify_locations(
			vh->tls.ssl_client_ctx, ca_filepath, NULL)) {
			lwsl_err(
				"Unable to load SSL Client certs "
				"file from %s -- client ssl isn't "
				"going to work\n", ca_filepath);
			lws_tls_err_describe_clear();
		}
		else
			lwsl_info("loaded ssl_ca_filepath\n");
	} else {

		lws_filepos_t amount = 0;
		uint8_t *up1;
		const uint8_t *up;

		if (lws_tls_alloc_pem_to_der_file(vh->context, NULL, ca_mem,
						  ca_mem_len, &up1,
						  &amount)) {
			lwsl_err("%s: Unable to decode x.509 mem\n", __func__);
			lwsl_hexdump_notice(ca_mem, ca_mem_len);
			return 1;
		}

		up = up1;
		client_CA = d2i_X509(NULL, &up, (long)amount);
		if (!client_CA) {
			lwsl_err("%s: d2i_X509 failed\n", __func__);
			lwsl_hexdump_notice(up1, (size_t)amount);
			lws_tls_err_describe_clear();
		} else {
			x509_store = X509_STORE_new();
			if (!X509_STORE_add_cert(x509_store, client_CA)) {
				X509_STORE_free(x509_store);
				lwsl_err("Unable to load SSL Client certs from "
					 "ssl_ca_mem -- client ssl isn't going to "
					 "work\n");
				lws_tls_err_describe_clear();
			} else {
				/* it doesn't increment x509_store ref counter */
				SSL_CTX_set_cert_store(vh->tls.ssl_client_ctx,
						       x509_store);
				lwsl_info("loaded ssl_ca_mem\n");
			}
		}
		if (client_CA)
			X509_free(client_CA);
		lws_free(up1);
	//	lws_tls_client_vhost_extra_cert_mem(vh, ca_mem, ca_mem_len);
	}

	/*
	 * callback allowing user code to load extra verification certs
	 * helping the client to verify server identity
	 */

	/* support for client-side certificate authentication */
	if (cert_filepath) {
		if (lws_tls_use_any_upgrade_check_extant(cert_filepath) !=
				LWS_TLS_EXTANT_YES &&
		    (info->options & LWS_SERVER_OPTION_IGNORE_MISSING_CERT))
			return 0;

		lwsl_notice("%s: doing cert filepath %s\n", __func__,
				cert_filepath);
		n = SSL_CTX_use_certificate_chain_file(vh->tls.ssl_client_ctx,
						       cert_filepath);
		if (n < 1) {
			lwsl_err("problem %d getting cert '%s'\n", n,
				 cert_filepath);
			lws_tls_err_describe_clear();
			return 1;
		}
		lwsl_notice("Loaded client cert %s\n", cert_filepath);
	} else if (cert_mem && cert_mem_len) {
		n = SSL_CTX_use_certificate_ASN1(vh->tls.ssl_client_ctx,
						 cert_mem_len, cert_mem);
		if (n < 1) {
			lwsl_err("%s: problem interpreting client cert\n",
				 __func__);
			lws_tls_err_describe_clear();
			return 1;
		}
	}
	if (private_key_filepath) {
		lwsl_notice("%s: doing private key filepath\n", __func__);
		lws_ssl_bind_passphrase(vh->tls.ssl_client_ctx, 1, info);
		/* set the private key from KeyFile */
		if (SSL_CTX_use_PrivateKey_file(vh->tls.ssl_client_ctx,
		    private_key_filepath, SSL_FILETYPE_PEM) != 1) {
			lwsl_err("use_PrivateKey_file '%s'\n",
				 private_key_filepath);
			lws_tls_err_describe_clear();
			return 1;
		}
		lwsl_notice("Loaded client cert private key %s\n",
			    private_key_filepath);

		/* verify private key */
		if (!SSL_CTX_check_private_key(vh->tls.ssl_client_ctx)) {
			lwsl_err("Private SSL key doesn't match cert\n");
			return 1;
		}
	}

	return 0;
}